

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_outputstream.cc
# Opt level: O1

Future<int> * __thiscall
CrailOutputstream::Write
          (Future<int> *__return_storage_ptr__,CrailOutputstream *this,
          shared_ptr<crail::ByteBuffer> *buf)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  unsigned_long_long uVar5;
  long *plVar6;
  BlockInfo *pBVar7;
  int iVar8;
  GetblockResponse get_block_res;
  shared_ptr<StorageClient> storage_client;
  element_type *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  unsigned_long_long local_168;
  GetblockResponse local_160;
  DatanodeInfo local_108;
  Future<GetblockResponse> local_e8;
  BlockInfo local_70;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"CrailOutputstream::Write buf->remaining ",0x28);
  peVar3 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  plVar6 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cout,peVar3->limit_ - peVar3->position_);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  peVar3 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar1 = peVar3->position_;
  iVar2 = peVar3->limit_;
  if ((iVar2 - iVar1 < 0) || (iVar2 == iVar1)) {
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_001302e8
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->is_done_ = true;
    __return_storage_ptr__->result_ = -1;
  }
  else {
    local_168 = this->position_;
    iVar8 = 0x100000 - ((uint)local_168 & 0xfffff);
    if (iVar8 < iVar2 - iVar1) {
      peVar3->limit_ = iVar8 + iVar1;
    }
    pBVar7 = BlockCache::GetBlock
                       ((this->block_cache_).
                        super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_168)
    ;
    if (((pBVar7->datanode_info_).ip_address_ == 0) || ((pBVar7->datanode_info_).port_ == 0)) {
      peVar4 = (this->namenode_client_).
               super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar4->_vptr_NamenodeClient[4])
                (&local_e8,peVar4,(this->file_info_).fd_,(this->file_info_).token_,this->position_,
                 this->position_);
      Future<GetblockResponse>::get(&local_160,&local_e8);
      Future<GetblockResponse>::~Future(&local_e8);
      if (local_160.super_NamenodeResponse.error_ < 0) {
        (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask =
             (_func_int **)&PTR_get_001302e8;
        (__return_storage_ptr__->task_).
        super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        (__return_storage_ptr__->task_).
        super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __return_storage_ptr__->is_done_ = true;
        __return_storage_ptr__->result_ = -1;
      }
      else {
        (pBVar7->datanode_info_).storage_type_ = local_160.block_info_.datanode_info_.storage_type_;
        (pBVar7->datanode_info_).storage_class_ =
             local_160.block_info_.datanode_info_.storage_class_;
        (pBVar7->datanode_info_).location_class_ =
             local_160.block_info_.datanode_info_.location_class_;
        (pBVar7->datanode_info_).ip_address_ = local_160.block_info_.datanode_info_.ip_address_;
        (pBVar7->datanode_info_).port_ = local_160.block_info_.datanode_info_.port_;
        pBVar7->lba_ = local_160.block_info_.lba_;
        pBVar7->addr_ = local_160.block_info_.addr_;
        pBVar7->length_ = local_160.block_info_.length_;
        pBVar7->lkey_ = local_160.block_info_.lkey_;
        local_70._vptr_BlockInfo = (_func_int **)&PTR__BlockInfo_00131a50;
        local_70.datanode_info_._vptr_DatanodeInfo = (_func_int **)&PTR__DatanodeInfo_00131a10;
        local_70.datanode_info_.storage_type_ = (pBVar7->datanode_info_).storage_type_;
        local_70.datanode_info_.storage_class_ = (pBVar7->datanode_info_).storage_class_;
        local_70.datanode_info_.location_class_ = (pBVar7->datanode_info_).location_class_;
        local_70.datanode_info_.ip_address_ = (pBVar7->datanode_info_).ip_address_;
        local_70.datanode_info_.port_ = (pBVar7->datanode_info_).port_;
        local_70.lba_ = local_160.block_info_.lba_;
        local_70.addr_ = local_160.block_info_.addr_;
        local_70.length_ = local_160.block_info_.length_;
        local_70.lkey_ = local_160.block_info_.lkey_;
        BlockCache::PutBlock
                  ((this->block_cache_).super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,this->position_,&local_70);
        BlockInfo::~BlockInfo(&local_70);
      }
      GetblockResponse::~GetblockResponse(&local_160);
      if (local_160.super_NamenodeResponse.error_ < 0) {
        return __return_storage_ptr__;
      }
    }
    peVar3 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this->position_ = this->position_ + ((long)peVar3->limit_ - (long)peVar3->position_);
    local_e8.super_AsyncTask<GetblockResponse>._vptr_AsyncTask =
         (_func_int **)&PTR__DatanodeInfo_00131a10;
    local_e8.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)&(pBVar7->datanode_info_).storage_type_;
    local_e8.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(pBVar7->datanode_info_).location_class_
    ;
    local_e8.result_.super_NamenodeResponse.super_RpcMessage._vptr_RpcMessage._0_4_ =
         (pBVar7->datanode_info_).port_;
    DatanodeInfo::~DatanodeInfo((DatanodeInfo *)&local_e8);
    local_e8.super_AsyncTask<GetblockResponse>._vptr_AsyncTask =
         (_func_int **)&PTR__DatanodeInfo_00131a10;
    local_e8.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)&(pBVar7->datanode_info_).storage_type_;
    local_e8.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(pBVar7->datanode_info_).location_class_
    ;
    local_e8.result_.super_NamenodeResponse.super_RpcMessage._vptr_RpcMessage._0_4_ =
         (pBVar7->datanode_info_).port_;
    DatanodeInfo::~DatanodeInfo((DatanodeInfo *)&local_e8);
    local_108._vptr_DatanodeInfo = (_func_int **)&PTR__DatanodeInfo_00131a10;
    local_108.storage_type_ = (pBVar7->datanode_info_).storage_type_;
    local_108.storage_class_ = (pBVar7->datanode_info_).storage_class_;
    local_108.location_class_ = (pBVar7->datanode_info_).location_class_;
    local_108.ip_address_ = (pBVar7->datanode_info_).ip_address_;
    local_108.port_ = (pBVar7->datanode_info_).port_;
    StorageCache::Get((StorageCache *)&local_e8,
                      (DatanodeInfo *)
                      (this->storage_cache_).
                      super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    DatanodeInfo::~DatanodeInfo(&local_108);
    uVar5 = pBVar7->addr_;
    iVar1 = pBVar7->lkey_;
    local_178 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_170 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
    if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_170->_M_use_count = local_170->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_170->_M_use_count = local_170->_M_use_count + 1;
      }
    }
    (**(code **)(*local_e8.super_AsyncTask<GetblockResponse>._vptr_AsyncTask + 0x10))
              (__return_storage_ptr__,local_e8.super_AsyncTask<GetblockResponse>._vptr_AsyncTask,
               iVar1,((uint)local_168 & 0xfffff) + uVar5,&local_178);
    if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
    }
    peVar3 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar3->position_ = peVar3->limit_;
    peVar3->limit_ = iVar2;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_e8.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.task_.
                 super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Future<int> CrailOutputstream::Write(shared_ptr<ByteBuffer> buf) {
  cout << "CrailOutputstream::Write buf->remaining " << buf->remaining()
       << endl;
  if (buf->remaining() < 0) {
    return Future<int>::Failure(-1);
  }
  if (buf->remaining() == 0) {
    return Future<int>::Failure(-1);
  }

  int block_offset = position_ % kBlockSize;
  int block_remaining = kBlockSize - block_offset;
  int buf_original_limit = buf->limit();

  if (block_remaining < buf->remaining()) {
    buf->set_limit(buf->position() + block_remaining);
  }

  BlockInfo &block_info = block_cache_->GetBlock(position_);
  if (!block_info.valid()) {
    GetblockResponse get_block_res =
        namenode_client_
            ->GetBlock(file_info_.fd(), file_info_.token(), position_,
                       position_)
            .get();

    if (get_block_res.error() < 0) {
      return Future<int>::Failure(-1);
    }

    block_info = get_block_res.block_info();
    block_cache_->PutBlock(position_, block_info);
  }

  this->position_ += buf->remaining();
  int address = block_info.datanode().addr();
  int port = block_info.datanode().port();

  shared_ptr<StorageClient> storage_client =
      storage_cache_->Get(block_info.datanode());
  long long block_addr = block_info.addr() + block_offset;
  Future<int> storage_response =
      storage_client->WriteData(block_info.lkey(), block_addr, buf);

  buf->set_position(buf->position() + buf->remaining());
  buf->set_limit(buf_original_limit);

  return storage_response;
}